

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

optional_ptr<duckdb::Binding,_true> __thiscall
duckdb::Binder::GetMatchingBinding
          (Binder *this,string *table_name,string *column_name,ErrorData *error)

{
  optional_ptr<duckdb::Binding,_true> oVar1;
  string empty_schema;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  oVar1 = GetMatchingBinding(this,&local_28,table_name,column_name,error);
  ::std::__cxx11::string::~string((string *)&local_28);
  return (optional_ptr<duckdb::Binding,_true>)oVar1.ptr;
}

Assistant:

optional_ptr<Binding> Binder::GetMatchingBinding(const string &table_name, const string &column_name,
                                                 ErrorData &error) {
	string empty_schema;
	return GetMatchingBinding(empty_schema, table_name, column_name, error);
}